

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O2

void ssw2mcpl_parse_args(int argc,char **argv,char **infile,char **outfile,char **cfgfile,
                        int *double_prec,int *surface_info,int *do_gzip)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  void *__ptr;
  char *__s2;
  char *pcVar4;
  int iVar5;
  
  *cfgfile = (char *)0x0;
  *infile = (char *)0x0;
  *outfile = (char *)0x0;
  *surface_info = 0;
  *double_prec = 0;
  *do_gzip = 1;
  iVar5 = 1;
  do {
    if (argc <= iVar5) {
      pcVar4 = *infile;
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "Error: Too few arguments! (run with -h or --help for usage instructions)";
      }
      else {
        __s2 = *outfile;
        if (__s2 == (char *)0x0) {
          __s2 = "output.mcpl";
          *outfile = "output.mcpl";
          pcVar4 = *infile;
        }
        iVar5 = strcmp(pcVar4,__s2);
        if (iVar5 != 0) {
          return;
        }
        pcVar4 = "Error: input and output files are identical.";
      }
LAB_00103f63:
      puts(pcVar4);
LAB_00103f68:
      exit(1);
    }
    pcVar4 = argv[iVar5];
    cVar1 = *pcVar4;
    if (cVar1 != '\0') {
      if ((((cVar1 == '-') && (pcVar4[1] == 'h')) && (pcVar4[2] == '\0')) ||
         (iVar2 = strcmp(pcVar4,"--help"), iVar2 == 0)) {
        __ptr = (void *)mcpl_usage_progname(*argv);
        puts("Usage:\n");
        printf("  %s [options] input.ssw [output.mcpl]\n\n",__ptr);
        puts(
            "Converts the Monte Carlo particles in the input.ssw file (MCNP Surface\nSource Write format) to MCPL format and stores in the designated output\nfile (defaults to \"output.mcpl\").\n\nOptions:\n\n  -h, --help   : Show this usage information.\n  -d, --double : Enable double-precision storage of floating point values.\n  -s, --surf   : Store SSW surface IDs in the MCPL userflags.\n  -n, --nogzip : Do not attempt to gzip output file.\n  -c FILE      : Embed entire configuration FILE (the input deck)\n                 used to produce input.ssw in the MCPL header."
            );
        free(__ptr);
        exit(0);
      }
      piVar3 = double_prec;
      if (cVar1 == '-') {
        if ((pcVar4[1] != 'c') || (pcVar4[2] != '\0')) {
          if ((pcVar4[1] != 'd') || (pcVar4[2] != '\0')) goto LAB_00103dba;
          goto LAB_00103e4c;
        }
        iVar5 = iVar5 + 1;
        if ((iVar5 == argc) || (*argv[iVar5] == '-')) {
          pcVar4 = "Error: Missing argument for -c";
          goto LAB_00103f63;
        }
        if (*cfgfile != (char *)0x0) {
          pcVar4 = "Error: -c specified more than once";
          goto LAB_00103f63;
        }
        *cfgfile = argv[iVar5];
      }
      else {
LAB_00103dba:
        iVar2 = strcmp(pcVar4,"--double");
        if ((iVar2 == 0) ||
           ((((piVar3 = surface_info, cVar1 == '-' && (pcVar4[1] == 's')) && (pcVar4[2] == '\0')) ||
            (iVar2 = strcmp(pcVar4,"--surf"), iVar2 == 0)))) {
LAB_00103e4c:
          *piVar3 = 1;
        }
        else if ((((cVar1 == '-') && (pcVar4[1] == 'n')) && (pcVar4[2] == '\0')) ||
                (iVar2 = strcmp(pcVar4,"--nogzip"), iVar2 == 0)) {
          *do_gzip = 0;
        }
        else {
          if (cVar1 == '-') {
            printf("Error: Unknown argument: %s\n",pcVar4);
            goto LAB_00103f68;
          }
          if (*infile == (char *)0x0) {
            *infile = pcVar4;
          }
          else {
            if (*outfile != (char *)0x0) {
              pcVar4 = "Error: Too many arguments! (run with -h or --help for usage instructions)";
              goto LAB_00103f63;
            }
            *outfile = pcVar4;
          }
        }
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void ssw2mcpl_parse_args(int argc,char **argv, const char** infile,
                         const char **outfile, const char **cfgfile,
                         int* double_prec, int* surface_info, int* do_gzip) {
  *cfgfile = 0;
  *infile = 0;
  *outfile = 0;
  *surface_info = 0;
  *double_prec = 0;
  *do_gzip = 1;
  int i;
  for (i=1; i < argc; ++i) {
    if (argv[i][0]=='\0')
      continue;
    if (strcmp(argv[i],"-h")==0||strcmp(argv[i],"--help")==0) {
      char * progname = mcpl_usage_progname(argv[0]);
      printf("Usage:\n\n");
      printf("  %s [options] input.ssw [output.mcpl]\n\n",progname);
      printf("Converts the Monte Carlo particles in the input.ssw file (MCNP Surface\n"
             "Source Write format) to MCPL format and stores in the designated output\n"
             "file (defaults to \"output.mcpl\").\n"
             "\n"
             "Options:\n"
             "\n"
             "  -h, --help   : Show this usage information.\n"
             "  -d, --double : Enable double-precision storage of floating point values.\n"
             "  -s, --surf   : Store SSW surface IDs in the MCPL userflags.\n"
             "  -n, --nogzip : Do not attempt to gzip output file.\n"
             "  -c FILE      : Embed entire configuration FILE (the input deck)\n"
             "                 used to produce input.ssw in the MCPL header.\n"
             );
      free(progname);
      exit(0);
    }
    if (strcmp(argv[i],"-c")==0) {
      if (i+1==argc||argv[i+1][0]=='-') {
        printf("Error: Missing argument for -c\n");
        exit(1);
      }
      ++i;
      if (*cfgfile) {
        printf("Error: -c specified more than once\n");
        exit(1);
      }
      *cfgfile = argv[i];
      continue;
    }

    if (strcmp(argv[i],"-d")==0||strcmp(argv[i],"--double")==0) {
      *double_prec = 1;
      continue;
    }
    if (strcmp(argv[i],"-s")==0||strcmp(argv[i],"--surf")==0) {
      *surface_info = 1;
      continue;
    }
    if (strcmp(argv[i],"-n")==0||strcmp(argv[i],"--nogzip")==0) {
      *do_gzip = 0;
      continue;
    }
    if (argv[i][0]=='-') {
      printf("Error: Unknown argument: %s\n",argv[i]);
      exit(1);
    }
    if (!*infile) {
      *infile = argv[i];
      continue;
    }
    if (!*outfile) {
      *outfile = argv[i];
      continue;
    }
    printf("Error: Too many arguments! (run with -h or --help for usage instructions)\n");
    exit(1);
  }
  if (!*infile) {
    printf("Error: Too few arguments! (run with -h or --help for usage instructions)\n");
    exit(1);
  }
  if (!*outfile)
    *outfile = "output.mcpl";
  if (strcmp(*infile,*outfile)==0) {
    //basic test, easy to cheat:
    printf("Error: input and output files are identical.\n");
    exit(1);
  }
}